

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
               *c,ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  ptrdiff_t _Num;
  ulong uVar5;
  char *str;
  
  pcVar3 = *(char **)c;
  sVar2 = strlen(pcVar3);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar5 = pBVar1->size_ + sVar2;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  if (sVar2 != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar3,sVar2);
  }
  pBVar1->size_ = uVar5;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar1->size_;
  uVar5 = sVar4 + 2;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
    sVar4 = pBVar1->size_;
  }
  pcVar3 = pBVar1->ptr_;
  (pcVar3 + sVar4)[0] = ':';
  (pcVar3 + sVar4)[1] = ' ';
  pBVar1->size_ = uVar5;
  if (-1 < (long)*(int *)(c + 0x20)) {
    pcVar3 = ItemNamer::at(vnam,(long)*(int *)(c + 0x20));
    sVar2 = strlen(pcVar3);
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    uVar5 = pBVar1->size_ + sVar2;
    if (pBVar1->capacity_ < uVar5) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
    }
    if (sVar2 != 0) {
      memmove(pBVar1->ptr_ + pBVar1->size_,pcVar3,sVar2);
    }
    pBVar1->size_ = uVar5;
    pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
    sVar4 = pBVar1->size_;
    uVar5 = sVar4 + 4;
    if (pBVar1->capacity_ < uVar5) {
      (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
      sVar4 = pBVar1->size_;
    }
    builtin_strncpy(pBVar1->ptr_ + sVar4," == ",4);
    pBVar1->size_ = uVar5;
  }
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,2ul>,std::array<int,0ul>,mp::EquivalenceId>
            (wrt,(CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::EquivalenceId>
                  *)(c + 0x28),vnam);
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}